

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void setptmode_all(global_State *g,GCproto *pt,int mode)

{
  GCproto *pt_00;
  GCobj *o;
  ptrdiff_t i;
  int mode_local;
  GCproto *pt_local;
  global_State *g_local;
  
  if ((pt->flags & 1) != 0) {
    for (o = (GCobj *)-(ulong)pt->sizekgc; (long)o < 0;
        o = (GCobj *)((long)&(o->gch).nextgc.gcptr64 + 1)) {
      pt_00 = *(GCproto **)((pt->k).ptr64 + (long)o * 8);
      if (pt_00->gct == '\a') {
        setptmode(g,pt_00,mode);
        setptmode_all(g,pt_00,mode);
      }
    }
  }
  return;
}

Assistant:

static void setptmode_all(global_State *g, GCproto *pt, int mode)
{
  ptrdiff_t i;
  if (!(pt->flags & PROTO_CHILD)) return;
  for (i = -(ptrdiff_t)pt->sizekgc; i < 0; i++) {
    GCobj *o = proto_kgc(pt, i);
    if (o->gch.gct == ~LJ_TPROTO) {
      setptmode(g, gco2pt(o), mode);
      setptmode_all(g, gco2pt(o), mode);
    }
  }
}